

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amd64.cpp
# Opt level: O0

void stackjit::Amd64Backend::convertIntToFloat
               (CodeGen *codeGen,FloatRegisters dest,ExtendedRegisters src)

{
  ExtendedRegisters local_17;
  value_type_conflict1 local_16 [4];
  ExtendedRegisters local_12;
  FloatRegisters local_11;
  ExtendedRegisters src_local;
  CodeGen *pCStack_10;
  FloatRegisters dest_local;
  CodeGen *codeGen_local;
  
  local_16[3] = 0xf3;
  local_12 = src;
  local_11 = dest;
  pCStack_10 = codeGen;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(codeGen,local_16 + 3);
  local_16[2] = 0x49;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(pCStack_10,local_16 + 2);
  local_16[1] = 0xf;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(pCStack_10,local_16 + 1);
  local_16[0] = '*';
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(pCStack_10,local_16);
  local_17 = local_12 | 0xc0 | local_11 << 3;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(pCStack_10,&local_17);
  return;
}

Assistant:

void Amd64Backend::convertIntToFloat(CodeGen& codeGen, FloatRegisters dest, ExtendedRegisters src) {
		codeGen.push_back(0xf3);
		codeGen.push_back(0x49);
		codeGen.push_back(0x0f);
		codeGen.push_back(0x2a);
		codeGen.push_back((0xc0 | (Byte)src | (Byte)dest << 3));
	}